

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

value * __thiscall
mjs::anon_unknown_35::encode_uri
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  int ch;
  value *pvVar1;
  bool bVar2;
  char *pcVar3;
  conversion_result cVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint8_t buffer [4];
  gc_heap_ptr_untyped local_80;
  value *local_70;
  gc_heap_ptr<mjs::global_object> *local_68;
  wstring res;
  wstring_view local_40;
  
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = L'\0';
  uVar7 = 0;
  local_70 = __return_storage_ptr__;
  local_68 = global;
  do {
    uVar6 = (uint)local_68 - uVar7;
    if ((uint)local_68 < uVar7 || uVar6 == 0) {
      local_40._M_len = res._M_string_length;
      local_40._M_str = res._M_dataplus._M_p;
      string::string((string *)&local_80,*(gc_heap **)this,&local_40);
      pvVar1 = local_70;
      value::value(local_70,(string *)&local_80);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
      std::__cxx11::wstring::~wstring((wstring *)&res);
      return pvVar1;
    }
    ch = *(int *)(s._M_len + (ulong)uVar7 * 4);
    bVar2 = anon_unknown_5::is_uri_unescaped(ch);
    if (bVar2) {
LAB_0014623d:
      std::__cxx11::wstring::push_back((wchar_t)&res);
      cVar4.length = 1;
      cVar4.code_point = L'\0';
    }
    else {
      local_80.heap_._0_1_ = (undefined1)ch;
      pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (";/?:@&=+$,","",&local_80);
      if ((ch == 0x23) || (pcVar3 != "")) goto LAB_0014623d;
      cVar4 = unicode::utf16_to_utf32<wchar_t>((wchar_t *)(s._M_len + (ulong)uVar7 * 4),uVar6);
      if (cVar4.length == 0) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = &PTR__exception_001d8300;
        __cxa_throw(puVar5,&(anonymous_namespace)::(anonymous_namespace)::encoder_exception::
                            typeinfo,std::exception::~exception);
      }
      uVar6 = unicode::utf32_to_utf8<unsigned_char>(cVar4.code_point,buffer);
      if (uVar6 == 0) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = &PTR__exception_001d8300;
        __cxa_throw(puVar5,&(anonymous_namespace)::(anonymous_namespace)::encoder_exception::
                            typeinfo,std::exception::~exception);
      }
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        anon_unknown_5::put_percent_hex_byte(&res,(uint)buffer[uVar8]);
      }
    }
    uVar7 = cVar4.length + uVar7;
  } while( true );
}

Assistant:

value encode_uri(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    return encode_uri_helper(global, s, [](int ch) { return is_uri_unescaped(ch) || is_uri_reserved(ch) || ch == '#'; } );
}